

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftio.cpp
# Opt level: O0

void CVmBifTIO::input_cancel(uint argc)

{
  int reset;
  vm_val_t val;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  vm_val_t local_18;
  
  CVmBif::check_argc(0,0x303e76);
  CVmStack::pop(&local_18);
  CVmConsole::read_line_cancel
            ((CVmConsole *)(ulong)CONCAT14(local_18.typ == VM_TRUE,in_stack_ffffffffffffffe0),
             in_stack_ffffffffffffffdc);
  return;
}

Assistant:

void CVmBifTIO::input_cancel(VMG_ uint argc)
{
    vm_val_t val;
    int reset;
    
    /* check arguments */
    check_argc(vmg_ argc, 1);

    /* get the 'reset' flag */
    G_stk->pop(&val);
    reset = (val.typ == VM_TRUE);

    /* cancel the line */
    G_console->read_line_cancel(vmg_ reset);
}